

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O2

void __thiscall Tle::ExtractExponential(Tle *this,string *str,double *val)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  TleException *pTVar4;
  char cVar5;
  char *pcVar6;
  undefined1 local_58 [8];
  string temp;
  
  local_58 = (undefined1  [8])&temp._M_string_length;
  temp._M_dataplus._M_p = (pointer)0x0;
  temp._M_string_length._0_1_ = 0;
  pcVar3 = (str->_M_dataplus)._M_p;
  pcVar6 = pcVar3;
  temp.field_2._8_8_ = val;
  do {
    if (pcVar6 == pcVar3 + str->_M_string_length) {
      bVar2 = Util::FromString<double>((string *)local_58,(double *)temp.field_2._8_8_);
      if (bVar2) {
        std::__cxx11::string::~string((string *)local_58);
        return;
      }
      pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(pTVar4,"Failed to convert value to double");
      __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar5 = (char)local_58;
    if (pcVar6 == pcVar3) {
      cVar1 = *pcVar6;
      if ((cVar1 != ' ') && (cVar1 != '+')) {
        if (cVar1 != '-') {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid sign");
          goto LAB_00112fef;
        }
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::push_back(cVar5);
    }
    else {
      cVar1 = *pcVar6;
      if (pcVar6 == pcVar3 + str->_M_string_length + -2) {
        if ((cVar1 != '-') && (cVar1 != '+')) {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid exponential sign");
          goto LAB_00112fef;
        }
        std::__cxx11::string::push_back(cVar5);
      }
      else if (9 < (int)cVar1 - 0x30U) {
        pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(pTVar4,"Invalid digit");
LAB_00112fef:
        __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::push_back(cVar5);
    pcVar6 = pcVar6 + 1;
    pcVar3 = (str->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void Tle::ExtractExponential(const std::string& str, double& val)
{
    std::string temp;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        if (i == str.begin())
        {
            if (*i == '-' || *i == '+' || *i == ' ')
            {
                if (*i == '-')
                {
                    temp += *i;
                }
                temp += '0';
                temp += '.';
            }
            else
            {
                throw TleException("Invalid sign");
            }
        }
        else if (i == str.end() - 2)
        {
            if (*i == '-' || *i == '+')
            {
                temp += 'e';
                temp += *i;
            }
            else
            {
                throw TleException("Invalid exponential sign");
            }
        }
        else
        {
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}